

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O2

void handlePrintOption(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"print",&local_39);
  bVar1 = cmdline::parser::exist(cmd,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::toString_abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_38);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void handlePrintOption(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    if( !cmd.exist("print") )
    {
        return;
    }

    std::cout << comp.getRobotModel().toString() << std::endl;
}